

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

ssize_t __thiscall
gpu::shared_device_buffer::write(shared_device_buffer *this,int __fd,void *__buf,size_t __n)

{
  cl_mem buffer;
  size_t offset;
  void *cb;
  Type TVar1;
  gpu_exception *this_00;
  element_type *this_01;
  void *ptr;
  shared_device_buffer *extraout_RAX;
  undefined4 in_register_00000034;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  undefined1 local_100 [24];
  Context context;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  void *local_20;
  size_t size_local;
  shared_host_buffer *buffer_local;
  shared_device_buffer *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    local_20 = __buf;
    buffer_local = (shared_host_buffer *)this;
    if ((void *)this->size_ < __buf) {
      context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
      this_00 = (gpu_exception *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_a0,(unsigned_long)local_20);
      std::operator+(&local_80,"Too many data for this device buffer: ",&local_a0);
      std::operator+(&local_60,&local_80," > ");
      to_string<unsigned_long>(&local_d0,this->size_);
      std::operator+(&local_40,&local_60,&local_d0);
      gpu_exception::gpu_exception(this_00,&local_40);
      context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0;
      __cxa_throw(this_00,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
    }
    Context::Context((Context *)(local_100 + 0x10));
    TVar1 = Context::type((Context *)(local_100 + 0x10));
    if (TVar1 == TypeOpenCL) {
      Context::cl((Context *)local_100);
      this_01 = std::
                __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_100);
      cb = local_20;
      buffer = (cl_mem)this->data_;
      offset = this->offset_;
      ptr = shared_host_buffer::get((shared_host_buffer *)size_local);
      ocl::OpenCLEngine::writeBuffer(this_01,buffer,1,offset,(size_t)cb,ptr);
      std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)local_100);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_120,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,&local_121);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"No GPU context!",&local_149);
      raiseException(&local_120,0x10c,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    Context::~Context((Context *)(local_100 + 0x10));
    this = extraout_RAX;
  }
  return (ssize_t)this;
}

Assistant:

void shared_device_buffer::write(const shared_host_buffer &buffer, size_t size)
{
	if (!size)
		return;

	if (size > size_)
		throw gpu_exception("Too many data for this device buffer: " + to_string(size) + " > " + to_string(size_));

	Context context;
	switch (context.type()) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL(cudaMemcpy(cuptr(), buffer.get(), size, cudaMemcpyHostToDevice));
		break;
#endif
	case Context::TypeOpenCL:
		context.cl()->writeBuffer((cl_mem) data_, CL_TRUE, offset_, size, buffer.get());
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}
}